

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O2

void duckdb::TimeTZAverageOperation::
     Operation<duckdb::dtime_tz_t,duckdb::AvgState<duckdb::hugeint_t>,duckdb::TimeTZAverageOperation>
               (AvgState<duckdb::hugeint_t> *state,dtime_tz_t *input,AggregateUnaryInput *aggr_unary
               )

{
  dtime_t input_00;
  
  input_00 = Time::NormalizeTimeTZ((dtime_tz_t)input->bits);
  state->count = state->count + 1;
  AddToHugeint::AddNumber<duckdb::AvgState<duckdb::hugeint_t>,long>(state,input_00.micros);
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &aggr_unary) {
		const auto micros = Time::NormalizeTimeTZ(input).micros;
		AverageSetOperation::template AddValues<STATE>(state, 1);
		AddToHugeint::template AddNumber<STATE, int64_t>(state, micros);
	}